

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O0

bool __thiscall
QCache<QString,_QIcon>::insert
          (QCache<QString,_QIcon> *this,QString *key,QIcon *object,qsizetype cost)

{
  long lVar1;
  Node *n_00;
  long in_RCX;
  void *in_RDX;
  char *in_RSI;
  QCache<QString,_QIcon> *in_RDI;
  long in_FS_OFFSET;
  qsizetype prevCost;
  Node *n;
  InsertionResult result;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  qsizetype in_stack_ffffffffffffff98;
  Data<QCache<QString,_QIcon>::Node> *in_stack_ffffffffffffffa8;
  bool local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->mx < in_RCX) {
    remove(in_RDI,in_RSI);
    if (in_RDX != (void *)0x0) {
      QIcon::~QIcon((QIcon *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      operator_delete(in_RDX,8);
    }
    local_21 = false;
  }
  else {
    trim(in_RDI,in_stack_ffffffffffffff98);
    QHashPrivate::Data<QCache<QString,_QIcon>::Node>::findOrInsert<QString>
              (in_stack_ffffffffffffffa8,(QString *)in_RDI);
    n_00 = QHashPrivate::iterator<QCache<QString,_QIcon>::Node>::node
                     ((iterator<QCache<QString,_QIcon>::Node> *)in_RDI);
    Node::createInPlace(n_00,(QString *)in_stack_ffffffffffffffa8,(QIcon *)in_RDI,
                        in_stack_ffffffffffffff98);
    (n_00->super_Chain).prev = &in_RDI->chain;
    (n_00->super_Chain).next = (in_RDI->chain).next;
    ((in_RDI->chain).next)->prev = &n_00->super_Chain;
    (in_RDI->chain).next = &n_00->super_Chain;
    in_RDI->total = in_RCX + in_RDI->total;
    local_21 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

bool insert(const Key &key, T *object, qsizetype cost = 1)
    {
        if (cost > mx) {
            remove(key);
            delete object;
            return false;
        }
        trim(mx - cost);
        auto result = d.findOrInsert(key);
        Node *n = result.it.node();
        if (result.initialized) {
            auto prevCost = n->value.cost;
            result.it.node()->emplace(object, cost);
            cost -= prevCost;
            relink(key);
        } else {
            Node::createInPlace(n, key, object, cost);
            n->prev = &chain;
            n->next = chain.next;
            chain.next->prev = n;
            chain.next = n;
        }
        total += cost;
        return true;
    }